

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmessagebox.cpp
# Opt level: O0

void QMessageBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QMessageBox *this;
  bool bVar1;
  Icon IVar2;
  TextFormat TVar3;
  TextInteractionFlags TVar4;
  Options OVar5;
  QMessageBox *this_00;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QMessageBox *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QMessageBox *_t;
  undefined4 in_stack_ffffffffffffff18;
  QFlagsStorage<QMessageBox::StandardButton> in_stack_ffffffffffffff1c;
  QPixmap *in_stack_ffffffffffffff20;
  QPixmap *in_stack_ffffffffffffff28;
  QPixmap *this_01;
  QMessageBox *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  QFlagsStorage<QMessageBox::StandardButton> in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  QPixmap *pQVar6;
  QFlagsStorage<QMessageBox::Option> options;
  QPixmap local_38 [48];
  long local_8;
  
  options.i = (Int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 0) && (in_EDX == 0)) {
    buttonClicked((QMessageBox *)0x7a99cf,
                  (QAbstractButton *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18)
                 );
  }
  if ((in_ESI != 5) ||
     (bVar1 = QtMocHelpers::indexOfMethod<void(QMessageBox::*)(QAbstractButton*)>
                        (in_RCX,(void **)buttonClicked,0,0), !bVar1)) {
    if (in_ESI == 1) {
      this_01 = *(QPixmap **)in_RCX;
      in_stack_ffffffffffffff30 = (QMessageBox *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff30) {
      case (QMessageBox *)0x0:
        text((QMessageBox *)in_stack_ffffffffffffff28);
        QString::operator=((QString *)in_stack_ffffffffffffff20,
                           (QString *)
                           CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18));
        QString::~QString((QString *)0x7a9a86);
        break;
      case (QMessageBox *)0x1:
        IVar2 = icon((QMessageBox *)in_stack_ffffffffffffff20);
        *(Icon *)this_01 = IVar2;
        break;
      case (QMessageBox *)0x2:
        iconPixmap((QMessageBox *)in_stack_ffffffffffffff28);
        QPixmap::operator=(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        QPixmap::~QPixmap(local_38);
        break;
      case (QMessageBox *)0x3:
        TVar3 = textFormat((QMessageBox *)in_stack_ffffffffffffff20);
        *(TextFormat *)this_01 = TVar3;
        break;
      case (QMessageBox *)0x4:
        pQVar6 = this_01;
        in_stack_ffffffffffffff44.i = (Int)standardButtons((QMessageBox *)this_01);
        QtMocHelpers::assignFlags<QFlags<QMessageBox::StandardButton>>
                  ((void *)0x7a9b17,(QFlags<QMessageBox::StandardButton>)in_stack_ffffffffffffff1c.i
                  );
        in_stack_ffffffffffffff28 = this_01;
        this_01 = pQVar6;
        break;
      case (QMessageBox *)0x5:
        detailedText((QMessageBox *)in_stack_ffffffffffffff28);
        QString::operator=((QString *)in_stack_ffffffffffffff20,
                           (QString *)
                           CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18));
        QString::~QString((QString *)0x7a9b4d);
        break;
      case (QMessageBox *)0x6:
        informativeText((QMessageBox *)in_stack_ffffffffffffff28);
        QString::operator=((QString *)in_stack_ffffffffffffff20,
                           (QString *)
                           CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18));
        QString::~QString((QString *)0x7a9b80);
        break;
      case (QMessageBox *)0x7:
        TVar4 = textInteractionFlags
                          ((QMessageBox *)
                           CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18));
        *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)this_01 =
             TVar4.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i;
        break;
      case (QMessageBox *)0x8:
        OVar5 = QMessageBox::options((QMessageBox *)in_stack_ffffffffffffff28);
        *(QFlagsStorageHelper<QMessageBox::Option,_4> *)this_01 =
             OVar5.super_QFlagsStorageHelper<QMessageBox::Option,_4>.
             super_QFlagsStorage<QMessageBox::Option>.i;
      }
      options.i = (Int)((ulong)this_01 >> 0x20);
    }
    if (in_ESI == 2) {
      this = *(QMessageBox **)in_RCX;
      this_00 = (QMessageBox *)(ulong)in_EDX;
      TVar4.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
      super_QFlagsStorage<Qt::TextInteractionFlag>.i =
           SUB84((ulong)in_stack_ffffffffffffff28 >> 0x20,0);
      switch(this_00) {
      case (QMessageBox *)0x0:
        setText(this,(QString *)in_stack_ffffffffffffff30);
        break;
      case (QMessageBox *)0x1:
        setIcon(in_stack_ffffffffffffff30,
                (Icon)TVar4.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                      super_QFlagsStorage<Qt::TextInteractionFlag>.i);
        break;
      case (QMessageBox *)0x2:
        setIconPixmap(this_00,(QPixmap *)
                              CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18));
        break;
      case (QMessageBox *)0x3:
        setTextFormat((QMessageBox *)CONCAT44(in_stack_ffffffffffffff44.i,in_stack_ffffffffffffff40)
                      ,(TextFormat)((ulong)this >> 0x20));
        break;
      case (QMessageBox *)0x4:
        setStandardButtons(this_00,(StandardButtons)options.i);
        break;
      case (QMessageBox *)0x5:
        setDetailedText((QMessageBox *)
                        CONCAT44(in_stack_ffffffffffffff44.i,in_stack_ffffffffffffff40),
                        (QString *)this);
        break;
      case (QMessageBox *)0x6:
        setInformativeText(in_RDI,(QString *)CONCAT44(2,in_EDX));
        break;
      case (QMessageBox *)0x7:
        setTextInteractionFlags(this_00,TVar4);
        break;
      case (QMessageBox *)0x8:
        setOptions(this,(Options)options.i);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMessageBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->buttonClicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMessageBox::*)(QAbstractButton * )>(_a, &QMessageBox::buttonClicked, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<Icon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<QPixmap*>(_v) = _t->iconPixmap(); break;
        case 3: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 4: QtMocHelpers::assignFlags<StandardButtons>(_v, _t->standardButtons()); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->detailedText(); break;
        case 6: *reinterpret_cast<QString*>(_v) = _t->informativeText(); break;
        case 7: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 8: *reinterpret_cast<Options*>(_v) = _t->options(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<Icon*>(_v)); break;
        case 2: _t->setIconPixmap(*reinterpret_cast<QPixmap*>(_v)); break;
        case 3: _t->setTextFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 4: _t->setStandardButtons(*reinterpret_cast<StandardButtons*>(_v)); break;
        case 5: _t->setDetailedText(*reinterpret_cast<QString*>(_v)); break;
        case 6: _t->setInformativeText(*reinterpret_cast<QString*>(_v)); break;
        case 7: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 8: _t->setOptions(*reinterpret_cast<Options*>(_v)); break;
        default: break;
        }
    }
}